

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  FILE *__stream;
  bool bVar3;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  reference pvVar10;
  long in_RDI;
  int top_blob_index_final;
  HardSwish *hardswish;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  Allocator *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  float in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  Mat *in_stack_fffffffffffffe80;
  Mat local_138;
  value_type local_f0;
  value_type local_a0;
  value_type local_40;
  value_type local_38;
  value_type local_30;
  size_type local_28;
  value_type local_1c;
  size_type local_18;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (local_10 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            (char *)in_stack_fffffffffffffe68);
    if (!bVar3) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      local_1c = *pvVar5;
      local_28 = local_18;
LAB_001584d9:
      do {
        do {
          local_28 = local_28 + 1;
          if (local_10 <= local_28) goto LAB_0015865a;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                     local_28);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  (char *)in_stack_fffffffffffffe68);
          if (bVar3) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_28);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                    ,(char *)in_stack_fffffffffffffe68);
            if (bVar3) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_28);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70),
                                      (char *)in_stack_fffffffffffffe68);
              if (bVar3) {
                std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_28);
                bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70),
                                        (char *)in_stack_fffffffffffffe68);
                if (bVar3) {
                  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
                  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_fffffffffffffe74,
                                                      in_stack_fffffffffffffe70),
                                          (char *)in_stack_fffffffffffffe68);
                  if (bVar3) goto LAB_001584d9;
                }
              }
            }
          }
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_28);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
        } while (sVar6 != 1);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->bottoms,0);
      } while (*pvVar5 != local_1c);
LAB_0015865a:
      if (local_28 != local_10) {
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        local_30 = *ppLVar4;
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_28);
        __stream = _stderr;
        local_38 = *ppLVar4;
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_convolutiondepthwise_activation %s %s\n",uVar7,uVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                (char *)in_stack_fffffffffffffe68);
        if (bVar3) {
          local_40 = local_38;
          if ((*(float *)&local_38[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_38[1]._vptr_Layer))) {
            *(undefined4 *)&local_30[1].type.field_2 = 2;
            ncnn::Mat::Mat(in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c,
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe68);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
            ncnn::Mat::~Mat((Mat *)0x1587c3);
            fVar1 = *(float *)&local_40[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_30[1].type.field_2 + 8),0);
            *pfVar9 = fVar1;
          }
          else {
            *(undefined4 *)&local_30[1].type.field_2 = 1;
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                  (char *)in_stack_fffffffffffffe68);
          if (bVar3) {
            local_a0 = local_38;
            *(undefined4 *)&local_30[1].type.field_2 = 3;
            ncnn::Mat::Mat(in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c,
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe68);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
            ncnn::Mat::~Mat((Mat *)0x1588b3);
            fVar1 = *(float *)&local_a0[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_30[1].type.field_2 + 8),0);
            *pfVar9 = fVar1;
            fVar1 = *(float *)((long)&local_a0[1]._vptr_Layer + 4);
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_30[1].type.field_2 + 8),1);
            *pfVar9 = fVar1;
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                                    ,(char *)in_stack_fffffffffffffe68);
            if (bVar3) {
              *(undefined4 *)&local_30[1].type.field_2 = 4;
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70),
                                      (char *)in_stack_fffffffffffffe68);
              if (bVar3) {
                *(undefined4 *)&local_30[1].type.field_2 = 5;
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffe74,
                                                    in_stack_fffffffffffffe70),
                                        (char *)in_stack_fffffffffffffe68);
                if (bVar3) {
                  local_f0 = local_38;
                  *(undefined4 *)&local_30[1].type.field_2 = 6;
                  in_stack_fffffffffffffe80 = &local_138;
                  ncnn::Mat::Mat(in_stack_fffffffffffffe80,(int)in_stack_fffffffffffffe7c,
                                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                                 in_stack_fffffffffffffe68);
                  ncnn::Mat::operator=
                            ((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                             (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
                  ncnn::Mat::~Mat((Mat *)0x158a3e);
                  in_stack_fffffffffffffe78 = *(float *)&local_f0[1]._vptr_Layer;
                  pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_30[1].type.field_2 + 8),0);
                  *pfVar9 = in_stack_fffffffffffffe78;
                  in_stack_fffffffffffffe7c = *(float *)((long)&local_f0[1]._vptr_Layer + 4);
                  pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_30[1].type.field_2 + 8),1);
                  *pfVar9 = in_stack_fffffffffffffe7c;
                }
              }
            }
          }
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_38->tops,0);
        iVar2 = *pvVar5;
        in_stack_fffffffffffffe70 = iVar2;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_30->tops,0);
        *pvVar5 = in_stack_fffffffffffffe70;
        in_stack_fffffffffffffe74 = (int)local_18;
        pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar2);
        pvVar10->producer = in_stack_fffffffffffffe74;
        std::__cxx11::string::operator=((string *)&local_38->type,"ncnnfused");
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}